

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_sk_ecdsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,uint8_t *flags,char **application,
              uchar **key_handle,size_t *handle_len,EVP_PKEY **ec_ctx)

{
  int iVar1;
  uchar *puVar2;
  char *pcVar3;
  EVP_PKEY *pk;
  uchar *handle;
  EVP_PKEY *ec_key;
  uchar *app;
  uchar *key;
  uchar *p;
  uchar *point_buf;
  uchar *curve;
  size_t app_len;
  size_t key_len;
  size_t pointlen;
  size_t curvelen;
  size_t *psStack_40;
  int rc;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  string_buf *decrypted_local;
  LIBSSH2_SESSION *session_local;
  
  curvelen._4_4_ = 0;
  handle = (uchar *)0x0;
  psStack_40 = pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = &decrypted->data;
  decrypted_local = (string_buf *)session;
  iVar1 = _libssh2_get_string(decrypted,&point_buf,&pointlen);
  if ((iVar1 != 0) || (pointlen == 0)) {
    _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"ECDSA no curve");
    return -1;
  }
  iVar1 = _libssh2_get_string((string_buf *)method_local,&p,&key_len);
  if (iVar1 != 0) {
    _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"ECDSA no point");
    return -1;
  }
  curvelen._4_4_ =
       _libssh2_ecdsa_curve_name_with_octal_new
                 ((EVP_PKEY **)&handle,p,key_len,LIBSSH2_EC_CURVE_NISTP256);
  if (curvelen._4_4_ == 0) {
    iVar1 = _libssh2_get_string((string_buf *)method_local,(uchar **)&ec_key,(size_t *)&curve);
    if (iVar1 == 0) {
      if ((flags == (uint8_t *)0x0) ||
         (iVar1 = _libssh2_get_byte((string_buf *)method_local,flags), iVar1 == 0)) {
        if ((key_handle != (uchar **)0x0) && (handle_len != (size_t *)0x0)) {
          pk = (EVP_PKEY *)0x0;
          iVar1 = _libssh2_get_string((string_buf *)method_local,(uchar **)&pk,handle_len);
          if (iVar1 != 0) {
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"No SK key_handle.");
            goto LAB_00130657;
          }
          if (*handle_len != 0) {
            puVar2 = (uchar *)(*(code *)decrypted_local->dataptr)(*handle_len,decrypted_local);
            *key_handle = puVar2;
            if (*key_handle != (uchar *)0x0) {
              memcpy(*key_handle,pk,*handle_len);
            }
          }
        }
        if ((((curvelen._4_4_ == 0) && (handle != (uchar *)0x0)) &&
            (pubkeydata_len_local != (size_t *)0x0)) && (method_len_local != (size_t *)0x0)) {
          curvelen._4_4_ =
               gen_publickey_from_ec_evp
                         ((LIBSSH2_SESSION *)decrypted_local,(uchar **)method_len_local,
                          (size_t *)pubkeydata_local,(uchar **)pubkeydata_len_local,psStack_40,1,
                          (EVP_PKEY *)handle);
        }
        if ((curvelen._4_4_ == 0) && (pubkeydata_len_local != (size_t *)0x0)) {
          app_len = (size_t)(curve + *psStack_40 + 4);
          app = (uchar *)(*(code *)decrypted_local->dataptr)(app_len,decrypted_local);
          if (app == (uchar *)0x0) {
            curvelen._4_4_ = -1;
            app = (uchar *)0x0;
            goto LAB_00130657;
          }
          key = app + *psStack_40;
          memcpy(app,(void *)*pubkeydata_len_local,*psStack_40);
          _libssh2_store_str(&key,(char *)ec_key,(size_t)curve);
          if ((application != (char **)0x0) && (curve != (uchar *)0x0)) {
            pcVar3 = (char *)(*(code *)decrypted_local->dataptr)(curve + 1,decrypted_local);
            *application = pcVar3;
            explicit_bzero(*application,curve + 1);
            memcpy(*application,ec_key,(size_t)curve);
          }
          (*(code *)decrypted_local[1].data)(*pubkeydata_len_local,decrypted_local);
          *psStack_40 = app_len;
          if (pubkeydata_len_local == (size_t *)0x0) {
            if (app != (uchar *)0x0) {
              (*(code *)decrypted_local[1].data)(app,decrypted_local);
            }
          }
          else {
            *pubkeydata_len_local = (size_t)app;
          }
        }
        if (ec_ctx == (EVP_PKEY **)0x0) {
          EVP_PKEY_free((EVP_PKEY *)handle);
        }
        else {
          *ec_ctx = (EVP_PKEY *)handle;
        }
        return curvelen._4_4_;
      }
      _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"No SK flags.");
    }
    else {
      _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"No SK application.");
    }
  }
  else {
    curvelen._4_4_ = -1;
    _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"ECDSA could not create key");
  }
LAB_00130657:
  if (handle != (uchar *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)handle);
  }
  if ((application != (char **)0x0) && (*application != (char *)0x0)) {
    (*(code *)decrypted_local[1].data)(application,decrypted_local);
    *application = (char *)0x0;
  }
  if ((key_handle != (uchar **)0x0) && (*key_handle != (uchar *)0x0)) {
    (*(code *)decrypted_local[1].data)(key_handle,decrypted_local);
    *key_handle = (uchar *)0x0;
  }
  return curvelen._4_4_;
}

Assistant:

static int
gen_publickey_from_sk_ecdsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                              struct string_buf *decrypted,
                                              unsigned char **method,
                                              size_t *method_len,
                                              unsigned char **pubkeydata,
                                              size_t *pubkeydata_len,
                                              uint8_t *flags,
                                              const char **application,
                                              const unsigned char **key_handle,
                                              size_t *handle_len,
                                              libssh2_ecdsa_ctx **ec_ctx)
{
    int rc = 0;
    size_t curvelen, pointlen, key_len, app_len;
    unsigned char *curve, *point_buf, *p, *key, *app;
    libssh2_ecdsa_ctx *ec_key = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Extracting ECDSA-SK public key"));

    if(_libssh2_get_string(decrypted, &curve, &curvelen) ||
        curvelen == 0) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no curve");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &point_buf, &pointlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no point");
        return -1;
    }

    rc = _libssh2_ecdsa_curve_name_with_octal_new(&ec_key,
                                                  point_buf, pointlen,
                                                  LIBSSH2_EC_CURVE_NISTP256);
    if(rc) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA could not create key");
        goto fail;
    }

    if(_libssh2_get_string(decrypted, &app, &app_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK application.");
        goto fail;
    }

    if(flags && _libssh2_get_byte(decrypted, flags)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK flags.");
        goto fail;
    }

    if(key_handle && handle_len) {
        unsigned char *handle = NULL;
        if(_libssh2_get_string(decrypted, &handle, handle_len)) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "No SK key_handle.");
            goto fail;
        }

        if(*handle_len > 0) {
            *key_handle = LIBSSH2_ALLOC(session, *handle_len);

            if(*key_handle) {
                memcpy((void *)*key_handle, handle, *handle_len);
            }
        }
    }

    if(rc == 0 && ec_key && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = ec_key;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pk, ec_key);
#endif

        rc = gen_publickey_from_ec_evp(session, method, method_len,
                                       pubkeydata, pubkeydata_len,
                                       1, pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

    if(rc == 0 && pubkeydata) {
        key_len = *pubkeydata_len + app_len + 4;
        key = LIBSSH2_ALLOC(session, key_len);

        if(!key) {
            rc = -1;
            goto fail;
        }

        p = key + *pubkeydata_len;

        memcpy(key, *pubkeydata, *pubkeydata_len);
        _libssh2_store_str(&p, (const char *)app, app_len);

        if(application && app_len > 0) {
            *application = (const char *)LIBSSH2_ALLOC(session, app_len + 1);
            _libssh2_explicit_zero((void *)*application, app_len + 1);
            memcpy((void *)*application, app, app_len);
        }

        LIBSSH2_FREE(session, *pubkeydata);
        *pubkeydata_len = key_len;

        if(pubkeydata)
            *pubkeydata = key;
        else if(key)
            LIBSSH2_FREE(session, key);
    }

    if(ec_ctx)
        *ec_ctx = ec_key;
    else
        _libssh2_ecdsa_free(ec_key);

    return rc;

fail:
    if(ec_key)
        _libssh2_ecdsa_free(ec_key);

    if(application && *application) {
        LIBSSH2_FREE(session, (void *)application);
        *application = NULL;
    }

    if(key_handle && *key_handle) {
        LIBSSH2_FREE(session, (void *)key_handle);
        *key_handle = NULL;
    }

    return rc;
}